

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

bool chaiscript::detail::Dispatch_Engine::is_attribute_call
               (vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                *t_funs,Function_Params *t_params,bool t_has_params,
               Type_Conversions_State *t_conversions)

{
  bool bVar1;
  undefined7 in_register_00000011;
  anon_class_16_2_0f64138c_for__M_pred __pred;
  
  if (((int)CONCAT71(in_register_00000011,t_has_params) == 0) ||
     (t_params->m_begin == t_params->m_end)) {
    bVar1 = false;
  }
  else {
    __pred.t_conversions = t_conversions;
    __pred.t_params = t_params;
    bVar1 = std::
            any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const*,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>,chaiscript::detail::Dispatch_Engine::is_attribute_call(std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>const&,chaiscript::Function_Params_const&,bool,chaiscript::Type_Conversions_State_const&)::_lambda(auto:1_const&)_1_>
                      ((t_funs->
                       super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (t_funs->
                       super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish,__pred);
  }
  return bVar1;
}

Assistant:

static bool is_attribute_call(const std::vector<Proxy_Function> &t_funs,
                                    const Function_Params &t_params,
                                    bool t_has_params,
                                    const Type_Conversions_State &t_conversions) noexcept {
        if (!t_has_params || t_params.empty()) {
          return false;
        }

        return std::any_of(std::begin(t_funs), std::end(t_funs), [&](const auto &fun) {
          return fun->is_attribute_function() && fun->compare_first_type(t_params[0], t_conversions);
        });
      }